

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

uint32_t icu_63::GreekUpper::getDiacriticData(UChar32 c)

{
  uint32_t local_c;
  UChar32 c_local;
  
  switch(c) {
  case 0x300:
  case 0x301:
  case 0x302:
  case 0x303:
  case 0x311:
  case 0x342:
    local_c = 0x4000;
    break;
  case 0x304:
  case 0x306:
  case 0x313:
  case 0x314:
  case 0x343:
    local_c = 0x20000;
    break;
  default:
    local_c = 0;
    break;
  case 0x308:
    local_c = 0x10000;
    break;
  case 0x344:
    local_c = 0x14000;
    break;
  case 0x345:
    local_c = 0x2000;
  }
  return local_c;
}

Assistant:

uint32_t getDiacriticData(UChar32 c) {
    switch (c) {
    case 0x0300:  // varia
    case 0x0301:  // tonos = oxia
    case 0x0342:  // perispomeni
    case 0x0302:  // circumflex can look like perispomeni
    case 0x0303:  // tilde can look like perispomeni
    case 0x0311:  // inverted breve can look like perispomeni
        return HAS_ACCENT;
    case 0x0308:  // dialytika = diaeresis
        return HAS_COMBINING_DIALYTIKA;
    case 0x0344:  // dialytika tonos
        return HAS_COMBINING_DIALYTIKA | HAS_ACCENT;
    case 0x0345:  // ypogegrammeni = iota subscript
        return HAS_YPOGEGRAMMENI;
    case 0x0304:  // macron
    case 0x0306:  // breve
    case 0x0313:  // comma above
    case 0x0314:  // reversed comma above
    case 0x0343:  // koronis
        return HAS_OTHER_GREEK_DIACRITIC;
    default:
        return 0;
    }
}